

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O3

void __thiscall vera::Material::set(Material *this,string *_property,float *_array1D,int _n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  float local_20 [4];
  
  local_20[3] = 0.0;
  local_20[2] = 0.0;
  local_20[1] = 0.0;
  local_20[0] = 1.0;
  if (0 < _n) {
    uVar8 = 0;
    do {
      if (uVar8 == 4) {
        __assert_fail("(i) >= 0 && (i) < (this->length())",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/glm/glm/./ext/../detail/type_vec4.inl"
                      ,0x1e1,
                      "T &glm::vec<4, float>::operator[](typename vec<4, T, Q>::length_type) [L = 4, T = float, Q = glm::packed_highp]"
                     );
      }
      iVar7 = (int)uVar8;
      pfVar9 = local_20;
      if (((iVar7 != 3) && (pfVar9 = local_20 + 1, iVar7 != 2)) &&
         (pfVar9 = local_20 + 3, iVar7 == 1)) {
        pfVar9 = local_20 + 2;
      }
      *pfVar9 = _array1D[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)_n != uVar8);
  }
  fVar4 = local_20[3];
  fVar3 = local_20[2];
  fVar2 = local_20[1];
  fVar1 = local_20[0];
  pmVar5 = std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
           ::operator[](&this->colors,_property);
  (pmVar5->field_0).x = fVar4;
  (pmVar5->field_1).y = fVar3;
  (pmVar5->field_2).z = fVar2;
  (pmVar5->field_3).w = fVar1;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType>_>_>
           ::operator[](&this->properties,_property);
  *pmVar6 = COLOR;
  return;
}

Assistant:

void Material::set(const std::string& _property, const float* _array1D, int _n) {
    glm::vec4 color = glm::vec4(0.0f, 0.0f, 0.0f, 1.0f);
    for (int i = 0; i < _n; i++)
        color[i] = _array1D[i];
    
    colors[_property] = color;
    properties[_property] = COLOR;
}